

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

int __thiscall ncnn::ParamDict::load_param_bin(ParamDict *this,DataReader *dr)

{
  uint uVar1;
  long lVar2;
  reference pvVar3;
  char *pcVar4;
  long *in_RSI;
  Mat *in_RDI;
  bool bVar5;
  float *ptr_1;
  int len_1;
  char *ptr;
  vector<char,_std::allocator<char>_> tmpstr;
  size_t len_padded;
  int len;
  bool is_string;
  bool is_array;
  size_t nread;
  int id;
  Allocator *in_stack_ffffffffffffff58;
  allocator_type *in_stack_ffffffffffffff60;
  allocator<char> *in_stack_ffffffffffffff68;
  int local_80;
  uint local_7c;
  char *local_78;
  allocator<char> local_59;
  vector<char,_std::allocator<char>_> local_58;
  Allocator *local_40;
  int local_38;
  undefined1 local_32;
  undefined1 local_31;
  ParamDict *in_stack_ffffffffffffffd0;
  uint local_24;
  long *local_20;
  int local_c;
  int *local_8;
  
  local_20 = in_RSI;
  clear(in_stack_ffffffffffffffd0);
  local_24 = 0;
  lVar2 = (**(code **)(*local_20 + 0x18))(local_20,&local_24,4);
  if (lVar2 == 4) {
    do {
      if (local_24 == 0xffffff17) {
        return 0;
      }
      local_31 = (int)local_24 < -0x5b03;
      local_32 = (int)local_24 < -0x5b67;
      if ((bool)local_32) {
        local_24 = 0xffffa498 - local_24;
      }
      else if ((bool)local_31) {
        local_24 = 0xffffa4fc - local_24;
      }
      if (0x1f < (int)local_24) {
        fprintf(_stderr,"id < NCNN_MAX_PARAM_COUNT failed (id=%d, NCNN_MAX_PARAM_COUNT=%d)",
                (ulong)local_24,0x20);
        fprintf(_stderr,"\n");
        return -1;
      }
      if ((bool)local_32) {
        local_38 = 0;
        lVar2 = (**(code **)(*local_20 + 0x18))(local_20,&local_38,4);
        if (lVar2 != 4) {
          fprintf(_stderr,"ParamDict read array length failed %zd",lVar2);
          fprintf(_stderr,"\n");
          return -1;
        }
        if (0xff < local_38) {
          fprintf(_stderr,"string too long (id=%d)",(ulong)local_24);
          fprintf(_stderr,"\n");
          return -1;
        }
        uVar1 = local_38 + 3U;
        if ((int)(local_38 + 3U) < 0) {
          uVar1 = local_38 + 6;
        }
        local_40 = (Allocator *)(long)(int)(uVar1 & 0xfffffffc);
        in_stack_ffffffffffffff60 = (allocator_type *)((long)&local_40->_vptr_Allocator + 1);
        in_stack_ffffffffffffff68 = &local_59;
        std::allocator<char>::allocator();
        std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)in_RDI,
                   (size_type)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
        std::allocator<char>::~allocator(&local_59);
        local_78 = std::vector<char,_std::allocator<char>_>::data
                             ((vector<char,_std::allocator<char>_> *)0x18a232);
        in_stack_ffffffffffffff58 =
             (Allocator *)(**(code **)(*local_20 + 0x18))(local_20,local_78,local_40);
        bVar5 = in_stack_ffffffffffffff58 == local_40;
        if (bVar5) {
          pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                             (&local_58,(size_type)local_40);
          *pvVar3 = '\0';
          pcVar4 = std::vector<char,_std::allocator<char>_>::data
                             ((vector<char,_std::allocator<char>_> *)0x18a328);
          std::__cxx11::string::operator=
                    ((string *)(in_RDI->refcount + (long)(int)local_24 * 0x1c + 0x14),pcVar4);
          in_RDI->refcount[(long)(int)local_24 * 0x1c] = 7;
        }
        else {
          fprintf(_stderr,"ParamDict read string failed %zd",in_stack_ffffffffffffff58);
          fprintf(_stderr,"\n");
          local_c = -1;
        }
        local_7c = (uint)!bVar5;
        std::vector<char,_std::allocator<char>_>::~vector
                  ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff60);
        if (local_7c != 0) {
          return local_c;
        }
      }
      else if ((bool)local_31) {
        local_80 = 0;
        lVar2 = (**(code **)(*local_20 + 0x18))(local_20,&local_80,4);
        if (lVar2 != 4) {
          fprintf(_stderr,"ParamDict read array length failed %zd",lVar2);
          fprintf(_stderr,"\n");
          return -1;
        }
        Mat::create(in_RDI,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                    (size_t)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        local_8 = in_RDI->refcount + (long)(int)local_24 * 0x1c + 2;
        lVar2 = (**(code **)(*local_20 + 0x18))(local_20,*(undefined8 *)local_8,(long)local_80 << 2)
        ;
        if (lVar2 != (long)local_80 * 4) {
          fprintf(_stderr,"ParamDict read array element failed %zd",lVar2);
          fprintf(_stderr,"\n");
          return -1;
        }
        in_RDI->refcount[(long)(int)local_24 * 0x1c] = 4;
      }
      else {
        lVar2 = (**(code **)(*local_20 + 0x18))
                          (local_20,in_RDI->refcount + (long)(int)local_24 * 0x1c + 1,4);
        if (lVar2 != 4) {
          fprintf(_stderr,"ParamDict read value failed %zd",lVar2);
          fprintf(_stderr,"\n");
          return -1;
        }
        in_RDI->refcount[(long)(int)local_24 * 0x1c] = 1;
      }
      lVar2 = (**(code **)(*local_20 + 0x18))(local_20,&local_24,4);
    } while (lVar2 == 4);
    fprintf(_stderr,"ParamDict read EOP failed %zd",lVar2);
    fprintf(_stderr,"\n");
  }
  else {
    fprintf(_stderr,"ParamDict read id failed %zd",lVar2);
    fprintf(_stderr,"\n");
  }
  return -1;
}

Assistant:

int ParamDict::load_param_bin(const DataReader& dr)
{
    clear();

    //     binary 0
    //     binary 100
    //     binary 1
    //     binary 1.250000
    //     binary 3 | array_bit
    //     binary 5
    //     binary 0.1
    //     binary 0.2
    //     binary 0.4
    //     binary 0.8
    //     binary 1.0
    //     binary -233(EOP)

    int id = 0;
    size_t nread;
    nread = dr.read(&id, sizeof(int));
    if (nread != sizeof(int))
    {
        NCNN_LOGE("ParamDict read id failed %zd", nread);
        return -1;
    }

#if __BIG_ENDIAN__
    swap_endianness_32(&id);
#endif

    while (id != -233)
    {
        bool is_array = id <= -23300;
        bool is_string = id <= -23400;
        if (is_string)
        {
            id = -id - 23400;
        }
        else if (is_array)
        {
            id = -id - 23300;
        }

        if (id >= NCNN_MAX_PARAM_COUNT)
        {
            NCNN_LOGE("id < NCNN_MAX_PARAM_COUNT failed (id=%d, NCNN_MAX_PARAM_COUNT=%d)", id, NCNN_MAX_PARAM_COUNT);
            return -1;
        }

        if (is_string)
        {
            int len = 0;
            nread = dr.read(&len, sizeof(int));
            if (nread != sizeof(int))
            {
                NCNN_LOGE("ParamDict read array length failed %zd", nread);
                return -1;
            }

#if __BIG_ENDIAN__
            swap_endianness_32(&len);
#endif

            if (len > 255)
            {
                NCNN_LOGE("string too long (id=%d)", id);
                return -1;
            }

            size_t len_padded = (len + 3) / 4 * 4;
            std::vector<char> tmpstr(len_padded + 1);

            char* ptr = (char*)tmpstr.data();
            nread = dr.read(ptr, len_padded);
            if (nread != len_padded)
            {
                NCNN_LOGE("ParamDict read string failed %zd", nread);
                return -1;
            }

            tmpstr[len_padded] = '\0';

            d->params[id].s = tmpstr.data();

            d->params[id].type = 7;
        }
        else if (is_array)
        {
            int len = 0;
            nread = dr.read(&len, sizeof(int));
            if (nread != sizeof(int))
            {
                NCNN_LOGE("ParamDict read array length failed %zd", nread);
                return -1;
            }

#if __BIG_ENDIAN__
            swap_endianness_32(&len);
#endif

            d->params[id].v.create(len);

            float* ptr = d->params[id].v;
            nread = dr.read(ptr, sizeof(float) * len);
            if (nread != sizeof(float) * len)
            {
                NCNN_LOGE("ParamDict read array element failed %zd", nread);
                return -1;
            }

#if __BIG_ENDIAN__
            for (int i = 0; i < len; i++)
            {
                swap_endianness_32(ptr + i);
            }
#endif

            d->params[id].type = 4;
        }
        else
        {
            nread = dr.read(&d->params[id].f, sizeof(float));
            if (nread != sizeof(float))
            {
                NCNN_LOGE("ParamDict read value failed %zd", nread);
                return -1;
            }

#if __BIG_ENDIAN__
            swap_endianness_32(&d->params[id].f);
#endif

            d->params[id].type = 1;
        }

        nread = dr.read(&id, sizeof(int));
        if (nread != sizeof(int))
        {
            NCNN_LOGE("ParamDict read EOP failed %zd", nread);
            return -1;
        }

#if __BIG_ENDIAN__
        swap_endianness_32(&id);
#endif
    }

    return 0;
}